

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void enableCursor(_GLFWwindow *window)

{
  long in_RDI;
  _GLFWwindow *in_stack_00000010;
  double in_stack_00000018;
  _GLFWwindow *in_stack_00000020;
  
  if (*(int *)(in_RDI + 0x1f8) != 0) {
    disableRawMouseMotion(in_stack_00000010);
  }
  _glfw.x11.disabledCursorWindow = (_GLFWwindow *)0x0;
  (*_glfw.x11.xlib.UngrabPointer)(_glfw.x11.display,0);
  _glfwPlatformSetCursorPos(in_stack_00000020,in_stack_00000018,(double)in_stack_00000010);
  updateCursorImage((_GLFWwindow *)0x19f58f);
  return;
}

Assistant:

static void enableCursor(_GLFWwindow* window)
{
    if (window->rawMouseMotion)
        disableRawMouseMotion(window);

    _glfw.x11.disabledCursorWindow = NULL;
    XUngrabPointer(_glfw.x11.display, CurrentTime);
    _glfwPlatformSetCursorPos(window,
                              _glfw.x11.restoreCursorPosX,
                              _glfw.x11.restoreCursorPosY);
    updateCursorImage(window);
}